

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent.cpp
# Opt level: O0

double ear::anon_unknown_0::extentMod(double extent,double distance)

{
  double dVar1;
  Scalar local_b8;
  Scalar local_b0;
  Matrix<double,_3,_1,_0,_3,_1> local_a8;
  Scalar local_90;
  Scalar local_88;
  Matrix<double,_3,_1,_0,_3,_1> local_80;
  double local_68;
  double extent1;
  Matrix<double,_2,_1,_0,_2,_1> local_58;
  double local_48;
  double local_40;
  Matrix<double,_2,_1,_0,_2,_1> local_38;
  double local_28;
  double size;
  double minSize;
  double distance_local;
  double extent_local;
  
  size = 0.2;
  local_40 = 0.0;
  local_48 = 360.0;
  minSize = distance;
  distance_local = extent;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<double,double>
            ((Matrix<double,2,1,0,2,1> *)&local_38,&local_40,&local_48);
  extent1 = 1.0;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<double,double>
            ((Matrix<double,2,1,0,2,1> *)&local_58,&size,&extent1);
  local_28 = interp<2,_2>(extent,&local_38,&local_58);
  dVar1 = atan2(local_28,1.0);
  local_68 = degrees<double,_0>(dVar1);
  local_68 = local_68 * 4.0;
  dVar1 = atan2(local_28,minSize);
  dVar1 = degrees<double,_0>(dVar1);
  local_88 = 0.0;
  local_90 = 360.0;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_80,&local_88,&local_68,&local_90);
  local_b0 = 0.0;
  local_b8 = 360.0;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_a8,&local_b0,&distance_local,&local_b8);
  dVar1 = interp<3,_3>(dVar1 * 4.0,&local_80,&local_a8);
  return dVar1;
}

Assistant:

double extentMod(double extent, double distance) {
      double minSize = 0.2;
      double size = interp(extent, Eigen::Vector2d(0.0, 360.0),
                           Eigen::Vector2d(minSize, 1.0));
      double extent1 = 4.0 * degrees(atan2(size, 1.0));
      return interp(4.0 * degrees(atan2(size, distance)),
                    Eigen::Vector3d(0.0, extent1, 360.0),
                    Eigen::Vector3d(0.0, extent, 360.0));
    }